

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O2

Result __thiscall
wabt::WastParser::ParseScriptModule
          (WastParser *this,
          unique_ptr<wabt::ScriptModule,_std::default_delete<wabt::ScriptModule>_> *out_module)

{
  ScriptModule *pSVar1;
  ScriptModule *pSVar2;
  bool bVar3;
  Result RVar4;
  TokenType TVar5;
  TokenTypePair pair;
  allocator<char> local_c1;
  ScriptModule *local_c0;
  Location loc;
  ScriptModule *local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  undefined1 local_58 [32];
  string name;
  
  RVar4 = Expect(this,Lpar);
  if (RVar4.enum_ == Error) {
    return (Result)Error;
  }
  GetLocation(&loc,this);
  RVar4 = Expect(this,Module);
  if (RVar4.enum_ == Error) {
    return (Result)Error;
  }
  name._M_dataplus._M_p = (pointer)&name.field_2;
  name._M_string_length = 0;
  name.field_2._M_local_buf[0] = '\0';
  ParseBindVarOpt(this,&name);
  TVar5 = Peek(this,0);
  if (TVar5 == Quote) {
    Consume((Token *)&data,this);
    data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    RVar4 = ParseTextList(this,&data);
    if (RVar4.enum_ == Error) {
LAB_0013d6b8:
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                (&data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
      RVar4.enum_ = Error;
      goto LAB_0013d7c3;
    }
    std::make_unique<wabt::DataScriptModule<(wabt::ScriptModuleType)2>>();
LAB_0013d747:
    std::__cxx11::string::_M_assign((string *)(local_98 + 3));
    *(int *)&local_98[2]._vptr_ScriptModule = loc.field_1.field_0.line;
    *(int *)((long)&local_98[2]._vptr_ScriptModule + 4) = loc.field_1.field_0.first_column;
    local_98[2].type_ = loc.field_1.field_0.last_column;
    *(undefined4 *)&local_98[2].field_0xc = loc.field_1._12_4_;
    *(undefined4 *)&local_98[1]._vptr_ScriptModule = (undefined4)loc.filename._M_len;
    *(undefined4 *)((long)&local_98[1]._vptr_ScriptModule + 4) = loc.filename._M_len._4_4_;
    local_98[1].type_ = (ScriptModuleType)loc.filename._M_str;
    *(undefined4 *)&local_98[1].field_0xc = loc.filename._M_str._4_4_;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(local_98 + 5),&data);
    pSVar2 = local_98;
    local_98 = (ScriptModule *)0x0;
    pSVar1 = (out_module->_M_t).
             super___uniq_ptr_impl<wabt::ScriptModule,_std::default_delete<wabt::ScriptModule>_>.
             _M_t.
             super__Tuple_impl<0UL,_wabt::ScriptModule_*,_std::default_delete<wabt::ScriptModule>_>.
             super__Head_base<0UL,_wabt::ScriptModule_*,_false>._M_head_impl;
    (out_module->_M_t).
    super___uniq_ptr_impl<wabt::ScriptModule,_std::default_delete<wabt::ScriptModule>_>._M_t.
    super__Tuple_impl<0UL,_wabt::ScriptModule_*,_std::default_delete<wabt::ScriptModule>_>.
    super__Head_base<0UL,_wabt::ScriptModule_*,_false>._M_head_impl = pSVar2;
    if ((pSVar1 != (ScriptModule *)0x0) &&
       ((*pSVar1->_vptr_ScriptModule[1])(), local_98 != (ScriptModule *)0x0)) {
      (*local_98->_vptr_ScriptModule[1])();
    }
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  }
  else {
    if (TVar5 == Bin) {
      Consume((Token *)&data,this);
      data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      RVar4 = ParseTextList(this,&data);
      if (RVar4.enum_ == Error) goto LAB_0013d6b8;
      std::make_unique<wabt::DataScriptModule<(wabt::ScriptModuleType)1>>();
      goto LAB_0013d747;
    }
    std::make_unique<wabt::TextScriptModule>();
    std::__cxx11::string::_M_assign((string *)(local_c0 + 3));
    local_c0[2]._vptr_ScriptModule =
         (_func_int **)CONCAT44(loc.field_1.field_0.first_column,loc.field_1.field_0.line);
    *(ulong *)&local_c0[2].type_ = CONCAT44(loc.field_1._12_4_,loc.field_1.field_0.last_column);
    local_c0[1]._vptr_ScriptModule =
         (_func_int **)CONCAT44(loc.filename._M_len._4_4_,(undefined4)loc.filename._M_len);
    *(ulong *)&local_c0[1].type_ =
         CONCAT44(loc.filename._M_str._4_4_,(ScriptModuleType)loc.filename._M_str);
    pair = PeekPair(this);
    bVar3 = anon_unknown_1::IsModuleField(pair);
    if (bVar3) {
      RVar4 = ParseModuleFieldList(this,(Module *)(local_c0 + 1));
      if (RVar4.enum_ == Error) {
        RVar4.enum_ = Error;
LAB_0013d87d:
        if (local_c0 != (ScriptModule *)0x0) {
          (*local_c0->_vptr_ScriptModule[1])();
        }
        goto LAB_0013d7c3;
      }
    }
    else {
      TVar5 = Peek(this,0);
      if (TVar5 != Rpar) {
        ConsumeIfLpar(this);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&data,"a module field",&local_c1);
        local_98 = (ScriptModule *)0x0;
        uStack_90 = 0;
        local_88 = 0;
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        _M_range_initialize<std::__cxx11::string_const*>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_98,
                   (string *)&data,local_58);
        RVar4 = ErrorExpected(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    *)&local_98,(char *)0x0);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_98);
        std::__cxx11::string::_M_dispose();
        goto LAB_0013d87d;
      }
    }
    pSVar2 = local_c0;
    local_c0 = (ScriptModule *)0x0;
    pSVar1 = (out_module->_M_t).
             super___uniq_ptr_impl<wabt::ScriptModule,_std::default_delete<wabt::ScriptModule>_>.
             _M_t.
             super__Tuple_impl<0UL,_wabt::ScriptModule_*,_std::default_delete<wabt::ScriptModule>_>.
             super__Head_base<0UL,_wabt::ScriptModule_*,_false>._M_head_impl;
    (out_module->_M_t).
    super___uniq_ptr_impl<wabt::ScriptModule,_std::default_delete<wabt::ScriptModule>_>._M_t.
    super__Tuple_impl<0UL,_wabt::ScriptModule_*,_std::default_delete<wabt::ScriptModule>_>.
    super__Head_base<0UL,_wabt::ScriptModule_*,_false>._M_head_impl = pSVar2;
    if ((pSVar1 != (ScriptModule *)0x0) &&
       ((*pSVar1->_vptr_ScriptModule[1])(), local_c0 != (ScriptModule *)0x0)) {
      (*local_c0->_vptr_ScriptModule[1])();
    }
  }
  RVar4 = Expect(this,Rpar);
  RVar4.enum_ = (Enum)(RVar4.enum_ == Error);
LAB_0013d7c3:
  std::__cxx11::string::_M_dispose();
  return (Result)RVar4.enum_;
}

Assistant:

Result WastParser::ParseScriptModule(
    std::unique_ptr<ScriptModule>* out_module) {
  WABT_TRACE(ParseScriptModule);
  EXPECT(Lpar);
  Location loc = GetLocation();
  EXPECT(Module);
  std::string name;
  ParseBindVarOpt(&name);

  switch (Peek()) {
    case TokenType::Bin: {
      Consume();
      std::vector<uint8_t> data;
      // TODO(binji): The spec allows this to be empty, switch to
      // ParseTextListOpt.
      CHECK_RESULT(ParseTextList(&data));

      auto bsm = std::make_unique<BinaryScriptModule>();
      bsm->name = name;
      bsm->loc = loc;
      bsm->data = std::move(data);
      *out_module = std::move(bsm);
      break;
    }

    case TokenType::Quote: {
      Consume();
      std::vector<uint8_t> data;
      // TODO(binji): The spec allows this to be empty, switch to
      // ParseTextListOpt.
      CHECK_RESULT(ParseTextList(&data));

      auto qsm = std::make_unique<QuotedScriptModule>();
      qsm->name = name;
      qsm->loc = loc;
      qsm->data = std::move(data);
      *out_module = std::move(qsm);
      break;
    }

    default: {
      auto tsm = std::make_unique<TextScriptModule>();
      tsm->module.name = name;
      tsm->module.loc = loc;
      if (IsModuleField(PeekPair())) {
        CHECK_RESULT(ParseModuleFieldList(&tsm->module));
      } else if (!PeekMatch(TokenType::Rpar)) {
        ConsumeIfLpar();
        return ErrorExpected({"a module field"});
      }
      *out_module = std::move(tsm);
      break;
    }
  }

  EXPECT(Rpar);
  return Result::Ok;
}